

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ArenaStringPtr::SetAllocated
          (ArenaStringPtr *this,string *default_value,string *value,Arena *arena)

{
  string *psVar1;
  pointer pcVar2;
  
  if (arena == (Arena *)0x0) {
    psVar1 = (string *)(this->tagged_ptr_).ptr_;
    if (psVar1 != default_value) {
      pcVar2 = (psVar1->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &psVar1->field_2) {
        operator_delete(pcVar2,(psVar1->field_2)._M_allocated_capacity + 1);
      }
      operator_delete(psVar1,0x20);
    }
    if (value != (string *)0x0) {
      (this->tagged_ptr_).ptr_ = value;
      return;
    }
  }
  else if (value != (string *)0x0) {
    (this->tagged_ptr_).ptr_ = value;
    Arena::Own<std::__cxx11::string>(arena,value);
    return;
  }
  (this->tagged_ptr_).ptr_ = default_value;
  return;
}

Assistant:

void ArenaStringPtr::SetAllocated(const std::string* default_value,
                                  std::string* value, ::google::protobuf::Arena* arena) {
  // Release what we have first.
  if (arena == nullptr && !IsDefault(default_value)) {
    delete UnsafeMutablePointer();
  }
  if (value == nullptr) {
    tagged_ptr_.Set(const_cast<std::string*>(default_value));
  } else {
#ifdef NDEBUG
    tagged_ptr_.Set(value);
    if (arena != nullptr) {
      arena->Own(value);
    }
#else
    // On debug builds, copy the string so the address differs.  delete will
    // fail if value was a stack-allocated temporary/etc., which would have
    // failed when arena ran its cleanup list.
    std::string* new_value = Arena::Create<std::string>(arena, *value);
    delete value;
    tagged_ptr_.Set(new_value);
#endif
  }
}